

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

TextureCube * __thiscall tcu::TextureCube::operator=(TextureCube *this,TextureCube *other)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  CubeFace face_00;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *this_00;
  ulong __new_size;
  int face;
  long lVar4;
  ConstPixelBufferAccess *levels [6];
  TextureCubeView local_68;
  
  if (this != other) {
    uVar1 = other->m_size;
    uVar2 = 0x20;
    if (uVar1 != 0) {
      uVar2 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x1f;
    }
    __new_size = (ulong)(0x20 - uVar2);
    this_00 = this->m_access;
    for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
      std::
      vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
      ::resize((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                *)(this_00 + -6),__new_size);
      std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
                (this_00,__new_size);
      levels[lVar4] =
           &((this_00->
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>).
             _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
      this_00 = this_00 + 1;
    }
    this->m_format = other->m_format;
    this->m_size = other->m_size;
    TextureCubeView::TextureCubeView(&local_68,0x20 - uVar2,&levels);
    (this->m_view).m_levels[5] = local_68.m_levels[5];
    (this->m_view).m_levels[3] = local_68.m_levels[3];
    (this->m_view).m_levels[4] = local_68.m_levels[4];
    (this->m_view).m_levels[1] = local_68.m_levels[1];
    (this->m_view).m_levels[2] = local_68.m_levels[2];
    (this->m_view).m_numLevels = local_68.m_numLevels;
    *(undefined4 *)&(this->m_view).field_0x4 = local_68._4_4_;
    (this->m_view).m_levels[0] = local_68.m_levels[0];
    for (uVar3 = 0; uVar3 != __new_size; uVar3 = uVar3 + 1) {
      face_00 = CUBEFACE_NEGATIVE_X;
      for (lVar4 = 0x10; lVar4 != 0xa0; lVar4 = lVar4 + 0x18) {
        if (*(long *)(*(long *)((long)this->m_data + lVar4 + -0x10) + 8 + uVar3 * 0x10) != 0) {
          clearLevel(this,face_00,(int)uVar3);
        }
        if (*(long *)(*(long *)((long)other->m_data + lVar4 + -0x10) + 8 + uVar3 * 0x10) != 0) {
          allocLevel(this,face_00,(int)uVar3);
          copy((EVP_PKEY_CTX *)
               (*(long *)((long)&this->m_data[5].
                                 super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + lVar4) + uVar3 * 0x28)
               ,(EVP_PKEY_CTX *)
                (*(long *)((long)&other->m_data[5].
                                  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + lVar4) + uVar3 * 0x28
                ));
        }
        face_00 = face_00 + CUBEFACE_POSITIVE_X;
      }
    }
  }
  return this;
}

Assistant:

TextureCube& TextureCube::operator= (const TextureCube& other)
{
	if (this == &other)
		return *this;

	const int						numLevels		= computeMipPyramidLevels(other.m_size);
	const ConstPixelBufferAccess*	levels[CUBEFACE_LAST];

	for (int face = 0; face < CUBEFACE_LAST; face++)
	{
		m_data[face].resize(numLevels);
		m_access[face].resize(numLevels);
		levels[face] = &m_access[face][0];
	}

	m_format	= other.m_format;
	m_size		= other.m_size;
	m_view		= TextureCubeView(numLevels, levels);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		for (int face = 0; face < CUBEFACE_LAST; face++)
		{
			if (!isLevelEmpty((CubeFace)face, levelNdx))
				clearLevel((CubeFace)face, levelNdx);

			if (!other.isLevelEmpty((CubeFace)face, levelNdx))
			{
				allocLevel((CubeFace)face, levelNdx);
				copy(getLevelFace(levelNdx, (CubeFace)face),
					 other.getLevelFace(levelNdx, (CubeFace)face));
			}
		}
	}

	return *this;
}